

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

String * __thiscall
asl::Map<asl::String,_asl::String>::operator[](Map<asl::String,_asl::String> *this,String *key)

{
  uint k;
  String local_60;
  KeyVal local_48;
  
  k = indexOf(this,key);
  if ((int)k < 0) {
    local_60.field_2._space[0] = '\0';
    local_60._size = 0;
    local_60._len = 0;
    KeyVal::KeyVal(&local_48,key,&local_60);
    k = ~k;
    Array<asl::Map<asl::String,_asl::String>::KeyVal>::insert(&this->a,k,&local_48);
    KeyVal::~KeyVal(&local_48);
    String::~String(&local_60);
  }
  return &(this->a)._a[k].value;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}